

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

void start_pass(j_decompress_ptr cinfo)

{
  J_DCT_METHOD JVar1;
  jpeg_inverse_dct *pjVar2;
  JQUANT_TBL *pJVar3;
  void *pvVar4;
  int iVar5;
  int local_60;
  int local_5c;
  int col;
  int row;
  FLOAT_MULT_TYPE *fmtbl;
  IFAST_MULT_TYPE *ifmtbl;
  ISLOW_MULT_TYPE *ismtbl;
  JQUANT_TBL *qtbl;
  inverse_DCT_method_ptr method_ptr;
  jpeg_component_info *pjStack_28;
  int method;
  jpeg_component_info *compptr;
  int i;
  int ci;
  my_idct_ptr idct;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->idct;
  method_ptr._4_4_ = 0;
  qtbl = (JQUANT_TBL *)0x0;
  compptr._4_4_ = 0;
  pjStack_28 = cinfo->comp_info;
  for (; compptr._4_4_ < cinfo->num_components; compptr._4_4_ = compptr._4_4_ + 1) {
    iVar5 = pjStack_28->DCT_h_scaled_size * 0x100 + pjStack_28->DCT_v_scaled_size;
    if (iVar5 == 0x101) {
      qtbl = (JQUANT_TBL *)jpeg_idct_1x1;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x102) {
      qtbl = (JQUANT_TBL *)jpeg_idct_1x2;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x201) {
      qtbl = (JQUANT_TBL *)jpeg_idct_2x1;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x202) {
      qtbl = (JQUANT_TBL *)jpeg_idct_2x2;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x204) {
      qtbl = (JQUANT_TBL *)jpeg_idct_2x4;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x303) {
      qtbl = (JQUANT_TBL *)jpeg_idct_3x3;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x306) {
      qtbl = (JQUANT_TBL *)jpeg_idct_3x6;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x402) {
      qtbl = (JQUANT_TBL *)jpeg_idct_4x2;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x404) {
      qtbl = (JQUANT_TBL *)jpeg_idct_4x4;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x408) {
      qtbl = (JQUANT_TBL *)jpeg_idct_4x8;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x505) {
      qtbl = (JQUANT_TBL *)jpeg_idct_5x5;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x50a) {
      qtbl = (JQUANT_TBL *)jpeg_idct_5x10;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x603) {
      qtbl = (JQUANT_TBL *)jpeg_idct_6x3;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x606) {
      qtbl = (JQUANT_TBL *)jpeg_idct_6x6;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x60c) {
      qtbl = (JQUANT_TBL *)jpeg_idct_6x12;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x707) {
      qtbl = (JQUANT_TBL *)jpeg_idct_7x7;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x70e) {
      qtbl = (JQUANT_TBL *)jpeg_idct_7x14;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x804) {
      qtbl = (JQUANT_TBL *)jpeg_idct_8x4;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x808) {
      JVar1 = cinfo->dct_method;
      if (JVar1 == JDCT_ISLOW) {
        qtbl = (JQUANT_TBL *)jpeg_idct_islow;
        method_ptr._4_4_ = 0;
      }
      else if (JVar1 == JDCT_IFAST) {
        qtbl = (JQUANT_TBL *)jpeg_idct_ifast;
        method_ptr._4_4_ = 1;
      }
      else if (JVar1 == JDCT_FLOAT) {
        qtbl = (JQUANT_TBL *)jpeg_idct_float;
        method_ptr._4_4_ = 2;
      }
      else {
        cinfo->err->msg_code = 0x31;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
    }
    else if (iVar5 == 0x810) {
      qtbl = (JQUANT_TBL *)jpeg_idct_8x16;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x909) {
      qtbl = (JQUANT_TBL *)jpeg_idct_9x9;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xa05) {
      qtbl = (JQUANT_TBL *)jpeg_idct_10x5;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xa0a) {
      qtbl = (JQUANT_TBL *)jpeg_idct_10x10;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xb0b) {
      qtbl = (JQUANT_TBL *)jpeg_idct_11x11;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xc06) {
      qtbl = (JQUANT_TBL *)jpeg_idct_12x6;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xc0c) {
      qtbl = (JQUANT_TBL *)jpeg_idct_12x12;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xd0d) {
      qtbl = (JQUANT_TBL *)jpeg_idct_13x13;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xe07) {
      qtbl = (JQUANT_TBL *)jpeg_idct_14x7;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xe0e) {
      qtbl = (JQUANT_TBL *)jpeg_idct_14x14;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0xf0f) {
      qtbl = (JQUANT_TBL *)jpeg_idct_15x15;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x1008) {
      qtbl = (JQUANT_TBL *)jpeg_idct_16x8;
      method_ptr._4_4_ = 0;
    }
    else if (iVar5 == 0x1010) {
      qtbl = (JQUANT_TBL *)jpeg_idct_16x16;
      method_ptr._4_4_ = 0;
    }
    else {
      cinfo->err->msg_code = 7;
      (cinfo->err->msg_parm).i[0] = pjStack_28->DCT_h_scaled_size;
      (cinfo->err->msg_parm).i[1] = pjStack_28->DCT_v_scaled_size;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    pjVar2->inverse_DCT[compptr._4_4_] = (inverse_DCT_method_ptr)qtbl;
    if (((pjStack_28->component_needed != 0) &&
        (*(int *)((long)pjVar2[1].inverse_DCT + (long)compptr._4_4_ * 4 + -8) != method_ptr._4_4_))
       && (pJVar3 = pjStack_28->quant_table, pJVar3 != (JQUANT_TBL *)0x0)) {
      *(int *)((long)pjVar2[1].inverse_DCT + (long)compptr._4_4_ * 4 + -8) = method_ptr._4_4_;
      if (method_ptr._4_4_ == 0) {
        pvVar4 = pjStack_28->dct_table;
        for (compptr._0_4_ = 0; (int)compptr < 0x40; compptr._0_4_ = (int)compptr + 1) {
          *(uint *)((long)pvVar4 + (long)(int)compptr * 4) = (uint)pJVar3->quantval[(int)compptr];
        }
      }
      else if (method_ptr._4_4_ == 1) {
        pvVar4 = pjStack_28->dct_table;
        for (compptr._0_4_ = 0; (int)compptr < 0x40; compptr._0_4_ = (int)compptr + 1) {
          *(int *)((long)pvVar4 + (long)(int)compptr * 4) =
               (int)((long)((ulong)pJVar3->quantval[(int)compptr] *
                            (long)start_pass::aanscales[(int)compptr] + 0x800) >> 0xc);
        }
      }
      else if (method_ptr._4_4_ == 2) {
        pvVar4 = pjStack_28->dct_table;
        compptr._0_4_ = 0;
        for (local_5c = 0; local_5c < 8; local_5c = local_5c + 1) {
          for (local_60 = 0; local_60 < 8; local_60 = local_60 + 1) {
            *(float *)((long)pvVar4 + (long)(int)compptr * 4) =
                 (float)((double)pJVar3->quantval[(int)compptr] *
                         start_pass::aanscalefactor[local_5c] * start_pass::aanscalefactor[local_60]
                        * 0.125);
            compptr._0_4_ = (int)compptr + 1;
          }
        }
      }
      else {
        cinfo->err->msg_code = 0x31;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
    }
    pjStack_28 = pjStack_28 + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass (j_decompress_ptr cinfo)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  int ci, tbl;
  jpeg_component_info * compptr;

  if (cinfo->progressive_mode) {
    /* Validate progressive scan parameters */
    if (cinfo->Ss == 0) {
      if (cinfo->Se != 0)
	goto bad;
    } else {
      /* need not check Ss/Se < 0 since they came from unsigned bytes */
      if (cinfo->Se < cinfo->Ss || cinfo->Se > cinfo->lim_Se)
	goto bad;
      /* AC scans may have only one component */
      if (cinfo->comps_in_scan != 1)
	goto bad;
    }
    if (cinfo->Ah != 0) {
      /* Successive approximation refinement scan: must have Al = Ah-1. */
      if (cinfo->Ah-1 != cinfo->Al)
	goto bad;
    }
    if (cinfo->Al > 13) {	/* need not check for < 0 */
      bad:
      ERREXIT4(cinfo, JERR_BAD_PROGRESSION,
	       cinfo->Ss, cinfo->Se, cinfo->Ah, cinfo->Al);
    }
    /* Update progression status, and verify that scan order is legal.
     * Note that inter-scan inconsistencies are treated as warnings
     * not fatal errors ... not clear if this is right way to behave.
     */
    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      int coefi, cindex = cinfo->cur_comp_info[ci]->component_index;
      int *coef_bit_ptr = & cinfo->coef_bits[cindex][0];
      if (cinfo->Ss && coef_bit_ptr[0] < 0) /* AC without prior DC scan */
	WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, 0);
      for (coefi = cinfo->Ss; coefi <= cinfo->Se; coefi++) {
	int expected = (coef_bit_ptr[coefi] < 0) ? 0 : coef_bit_ptr[coefi];
	if (cinfo->Ah != expected)
	  WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, coefi);
	coef_bit_ptr[coefi] = cinfo->Al;
      }
    }
    /* Select MCU decoding routine */
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
	entropy->pub.decode_mcu = decode_mcu_DC_first;
      else
	entropy->pub.decode_mcu = decode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
	entropy->pub.decode_mcu = decode_mcu_DC_refine;
      else
	entropy->pub.decode_mcu = decode_mcu_AC_refine;
    }
  } else {
    /* Check that the scan parameters Ss, Se, Ah/Al are OK for sequential JPEG.
     * This ought to be an error condition, but we make it a warning.
     */
    if (cinfo->Ss != 0 || cinfo->Ah != 0 || cinfo->Al != 0 ||
	(cinfo->Se < DCTSIZE2 && cinfo->Se != cinfo->lim_Se))
      WARNMS(cinfo, JWRN_NOT_SEQUENTIAL);
    /* Select MCU decoding routine */
    entropy->pub.decode_mcu = decode_mcu;
  }

  /* Allocate & initialize requested statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    if (! cinfo->progressive_mode || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      tbl = compptr->dc_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->dc_stats[tbl] == NULL)
	entropy->dc_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, DC_STAT_BINS);
      MEMZERO(entropy->dc_stats[tbl], DC_STAT_BINS);
      /* Initialize DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    if ((! cinfo->progressive_mode && cinfo->lim_Se) ||
	(cinfo->progressive_mode && cinfo->Ss)) {
      tbl = compptr->ac_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->ac_stats[tbl] == NULL)
	entropy->ac_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, AC_STAT_BINS);
      MEMZERO(entropy->ac_stats[tbl], AC_STAT_BINS);
    }
  }

  /* Initialize arithmetic decoding variables */
  entropy->c = 0;
  entropy->a = 0;
  entropy->ct = -16;	/* force reading 2 initial bytes to fill C */

  /* Initialize restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}